

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# button.c
# Opt level: O0

uint16_t modifier_mask_from_keysym
                   (xcb_key_symbols_t *symbols,xcb_keycode_t *modifiers,uint8_t modifier_count,
                   uint8_t keycodes_per_modifier,xcb_keysym_t keysym)

{
  xcb_keycode_t *__ptr;
  xcb_keycode_t *local_40;
  xcb_keycode_t *key;
  xcb_keycode_t modifier;
  uint8_t j;
  uint8_t i;
  xcb_keycode_t *keycodes;
  xcb_keysym_t keysym_local;
  uint8_t keycodes_per_modifier_local;
  uint8_t modifier_count_local;
  xcb_keycode_t *modifiers_local;
  xcb_key_symbols_t *symbols_local;
  
  __ptr = (xcb_keycode_t *)xcb_key_symbols_get_keycode(symbols,keysym);
  if (__ptr != (xcb_keycode_t *)0x0) {
    for (key._7_1_ = 0; key._7_1_ < modifier_count; key._7_1_ = key._7_1_ + 1) {
      for (key._6_1_ = 0; key._6_1_ < keycodes_per_modifier; key._6_1_ = key._6_1_ + 1) {
        local_40 = __ptr;
        if (modifiers[(int)((uint)key._7_1_ * (uint)keycodes_per_modifier + (uint)key._6_1_)] !=
            '\0') {
          for (; *local_40 != '\0'; local_40 = local_40 + 1) {
            if (*local_40 ==
                modifiers[(int)((uint)key._7_1_ * (uint)keycodes_per_modifier + (uint)key._6_1_)]) {
              free(__ptr);
              return (uint16_t)(1 << (key._7_1_ & 0x1f));
            }
          }
        }
      }
    }
    free(__ptr);
  }
  return 0;
}

Assistant:

static uint16_t modifier_mask_from_keysym(xcb_key_symbols_t *symbols,
                                          const xcb_keycode_t *modifiers, uint8_t modifier_count,
                                          uint8_t keycodes_per_modifier, xcb_keysym_t keysym)
{
        xcb_keycode_t *keycodes = xcb_key_symbols_get_keycode(symbols, keysym);

        if (keycodes == NULL) {
                return 0;
        }

        for (uint8_t i = 0; i < modifier_count; ++i) {
                for (uint8_t j = 0; j < keycodes_per_modifier; ++j) {
                        xcb_keycode_t modifier = modifiers[i * keycodes_per_modifier + j];

                        if (modifier == XCB_NONE) {
                                continue;
                        }

                        for (xcb_keycode_t *key = keycodes; *key != XCB_NONE; key++) {
                                if (*key == modifier) {
                                        free(keycodes);

                                        return (uint16_t)(1 << i);
                                }
                        }
                }
        }

        free(keycodes);

        return 0;
}